

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void recff_ffi_abi(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef TVar2;
  
  uVar1 = *J->base;
  if ((uVar1 & 0x1f000000) == 0x4000000) {
    TVar2 = lj_ir_kgc(J,(GCobj *)(ulong)(rd->argv->u32).lo,IRT_STR);
    (J->fold).ins.field_0.ot = 0x884;
    (J->fold).ins.field_0.op1 = (IRRef1)uVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    lj_opt_fold(J);
    J->postproc = LJ_POST_FIXBOOL;
    *J->base = 0x2007ffd;
    return;
  }
  lj_trace_err(J,LJ_TRERR_BADTYPE);
}

Assistant:

void LJ_FASTCALL recff_ffi_abi(jit_State *J, RecordFFData *rd)
{
  if (tref_isstr(J->base[0])) {
    /* Specialize to the ABI string to make the boolean result a constant. */
    emitir(IRTG(IR_EQ, IRT_STR), J->base[0], lj_ir_kstr(J, strV(&rd->argv[0])));
    J->postproc = LJ_POST_FIXBOOL;
    J->base[0] = TREF_TRUE;
  } else {
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
}